

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_addic_(DisasContext_conflict10 *ctx)

{
  gen_op_addic(ctx,true);
  return;
}

Assistant:

static void gen_addic_(DisasContext *ctx)
{
    gen_op_addic(ctx, 1);
}